

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::BuildSkelHierarchy(Skeleton *skel,SkelNode *dst,string *err)

{
  bool bVar1;
  difference_type __n;
  ostream *poVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  double *pdVar8;
  undefined8 *puVar9;
  double *pdVar10;
  undefined8 *puVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  size_t i;
  ulong uVar12;
  long lVar13;
  byte bVar14;
  string *in_stack_fffffffffffffbe0;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> joints;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> restTransforms;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> jointNames;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> bindTransforms;
  vector<int,_std::allocator<int>_> parentJointIds;
  string local_378;
  difference_type nroots;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> visitSet;
  ostringstream ss_e;
  undefined4 uStack_31c;
  undefined1 local_1a8 [32];
  _Alloc_hider local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  int local_168;
  double local_160;
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  double local_138;
  double local_130;
  double dStack_128;
  double local_120;
  double dStack_118;
  double local_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double local_b0;
  double dStack_a8;
  double local_a0;
  double dStack_98;
  double local_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  pointer local_60;
  pointer pSStack_58;
  pointer local_50;
  _Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> local_48;
  
  bVar14 = 0;
  bVar1 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::authored
                    (&skel->joints);
  if (!bVar1) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"BuildSkelHierarchy");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb89);
    ::std::operator<<(poVar2," ");
    ::std::__cxx11::string::string
              ((string *)&visitSet,"Skeleton.joints attrbitue is not authored: {}",
               (allocator *)&local_378);
    fmt::format<std::__cxx11::string>
              ((string *)local_1a8,(fmt *)&visitSet,(string *)&skel->name,in_RCX);
    poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)local_1a8);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    return false;
  }
  joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::get_value
                    (&skel->joints,&joints);
  if (bVar1) {
    if (joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_start !=
        joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      jointNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      jointNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      jointNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
              authored(&skel->jointNames);
      if (bVar1) {
        bVar1 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
                get_value(&skel->jointNames,&jointNames);
        if (bVar1) {
          in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)jointNames.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)jointNames.
                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_start);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start) == in_RCX) goto LAB_0027bbbf;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"BuildSkelHierarchy");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xba3);
          ::std::operator<<(poVar2," ");
          ::std::__cxx11::string::string
                    ((string *)&visitSet,
                     "Skeleton.joints.size {} must be equal to Skeleton.jointNames.size {}: {}",
                     (allocator *)&bindTransforms);
          local_378._M_dataplus._M_p =
               (pointer)((long)joints.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)joints.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5);
          restTransforms.
          super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)((long)jointNames.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)jointNames.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5);
          fmt::format<unsigned_long,unsigned_long,std::__cxx11::string>
                    ((string *)local_1a8,(fmt *)&visitSet,&local_378,
                     (unsigned_long *)&restTransforms,(unsigned_long *)&skel->name,in_R9);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"BuildSkelHierarchy");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb9c);
          ::std::operator<<(poVar2," ");
          ::std::__cxx11::string::string
                    ((string *)&visitSet,"Failed to get Skeleton.jointNames attrbitue: {}",
                     (allocator *)&local_378);
          fmt::format<std::__cxx11::string>
                    ((string *)local_1a8,(fmt *)&visitSet,(string *)&skel->name,in_RCX);
        }
        poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)local_1a8);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::append((string *)err);
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        bVar1 = false;
      }
      else {
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::resize
                  (&jointNames,
                   (long)joints.
                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)joints.
                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 5);
        lVar6 = 0;
        for (uVar12 = 0;
            uVar12 < (ulong)((long)joints.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)joints.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar12 = uVar12 + 1) {
          ::std::__cxx11::string::_M_assign
                    ((string *)
                     ((long)&((jointNames.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_start)->str_)._M_dataplus._M_p +
                     lVar6));
          lVar6 = lVar6 + 0x20;
        }
LAB_0027bbbf:
        restTransforms.
        super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        restTransforms.
        super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        restTransforms.
        super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar1 = TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                ::authored(&skel->restTransforms);
        if (bVar1) {
          bVar1 = TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                  ::get_value(&skel->restTransforms,&restTransforms);
          if (bVar1) goto LAB_0027c018;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"BuildSkelHierarchy");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xbb2);
          ::std::operator<<(poVar2," ");
          ::std::__cxx11::string::string
                    ((string *)&visitSet,"Failed to get Skeleton.restTransforms attrbitue: {}",
                     (allocator *)&local_378);
          fmt::format<std::__cxx11::string>
                    ((string *)local_1a8,(fmt *)&visitSet,(string *)&skel->name,in_RCX);
LAB_0027c2cc:
          poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)local_1a8);
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar1 = false;
        }
        else {
          _ss_e = 0x3ff0000000000000;
          ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
          _M_fill_assign(&restTransforms,
                         (long)joints.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)joints.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5,(value_type *)&ss_e);
LAB_0027c018:
          pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)restTransforms.
                          super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)restTransforms.
                          super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 7);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 5) != pbVar4) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"BuildSkelHierarchy");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xbbd);
            ::std::operator<<(poVar2," ");
            ::std::__cxx11::string::string
                      ((string *)&visitSet,
                       "Skeleton.joints.size {} must be equal to Skeleton.restTransforms.size {}: {}"
                       ,(allocator *)&parentJointIds);
            local_378._M_dataplus._M_p =
                 (pointer)((long)joints.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)joints.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
            bindTransforms.
            super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((long)restTransforms.
                                 super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)restTransforms.
                                 super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 7);
            fmt::format<unsigned_long,unsigned_long,std::__cxx11::string>
                      ((string *)local_1a8,(fmt *)&visitSet,&local_378,
                       (unsigned_long *)&bindTransforms,(unsigned_long *)&skel->name,in_R9);
            goto LAB_0027c2cc;
          }
          bindTransforms.
          super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          bindTransforms.
          super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          bindTransforms.
          super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar1 = TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                  ::authored(&skel->bindTransforms);
          if (bVar1) {
            bVar1 = TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                    ::get_value(&skel->bindTransforms,&bindTransforms);
            if (bVar1) goto LAB_0027c4d1;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"BuildSkelHierarchy");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xbc4);
            ::std::operator<<(poVar2," ");
            ::std::__cxx11::string::string
                      ((string *)&visitSet,"Failed to get Skeleton.bindTransforms attrbitue: {}",
                       (allocator *)&local_378);
            fmt::format<std::__cxx11::string>
                      ((string *)local_1a8,(fmt *)&visitSet,(string *)&skel->name,pbVar4);
LAB_0027c62e:
            poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)local_1a8);
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::append((string *)err);
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar1 = false;
          }
          else {
            _ss_e = 0x3ff0000000000000;
            ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
            _M_fill_assign(&restTransforms,
                           (long)joints.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)joints.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5,(value_type *)&ss_e)
            ;
LAB_0027c4d1:
            if ((long)joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 5 !=
                (long)bindTransforms.
                      super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)bindTransforms.
                      super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 7) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar2 = ::std::operator<<(poVar2,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                        );
              poVar2 = ::std::operator<<(poVar2,":");
              poVar2 = ::std::operator<<(poVar2,"BuildSkelHierarchy");
              poVar2 = ::std::operator<<(poVar2,"():");
              poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xbcf);
              ::std::operator<<(poVar2," ");
              ::std::__cxx11::string::string
                        ((string *)&visitSet,
                         "Skeleton.joints.size {} must be equal to Skeleton.bindTransforms.size {}: {}"
                         ,(allocator *)&nroots);
              local_378._M_dataplus._M_p =
                   (pointer)((long)joints.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)joints.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
              parentJointIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((long)bindTransforms.
                                   super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)bindTransforms.
                                   super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 7);
              fmt::format<unsigned_long,unsigned_long,std::__cxx11::string>
                        ((string *)local_1a8,(fmt *)&visitSet,&local_378,
                         (unsigned_long *)&parentJointIds,(unsigned_long *)&skel->name,in_R9);
              goto LAB_0027c62e;
            }
            parentJointIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            parentJointIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            parentJointIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            bVar1 = BuildSkelTopology(&joints,&parentJointIds,err);
            if (bVar1) {
              nroots = 0;
              for (pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            parentJointIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pbVar4 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            parentJointIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&(pbVar4->_M_dataplus)._M_p + 4)) {
                nroots = nroots + (ulong)(*(int *)&(pbVar4->_M_dataplus)._M_p == -1);
              }
              if (nroots != 1) {
                if (nroots == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
                  poVar2 = ::std::operator<<(poVar2,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                            );
                  poVar2 = ::std::operator<<(poVar2,":");
                  poVar2 = ::std::operator<<(poVar2,"BuildSkelHierarchy");
                  poVar2 = ::std::operator<<(poVar2,"():");
                  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xbdf);
                  ::std::operator<<(poVar2," ");
                  ::std::__cxx11::string::string
                            ((string *)&visitSet,"Invalid Skel topology. No root joint found: {}",
                             (allocator *)&local_378);
                  fmt::format<std::__cxx11::string>
                            ((string *)local_1a8,(fmt *)&visitSet,(string *)&skel->name,pbVar4);
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
                  poVar2 = ::std::operator<<(poVar2,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                            );
                  poVar2 = ::std::operator<<(poVar2,":");
                  poVar2 = ::std::operator<<(poVar2,"BuildSkelHierarchy");
                  poVar2 = ::std::operator<<(poVar2,"():");
                  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xbe6);
                  ::std::operator<<(poVar2," ");
                  ::std::__cxx11::string::string
                            ((string *)&visitSet,
                             "Invalid Skel topology. Topology must be single-rooted, but it has {} roots: {}"
                             ,(allocator *)&local_378);
                  fmt::format<long,std::__cxx11::string>
                            ((string *)local_1a8,(fmt *)&visitSet,(string *)&nroots,
                             (long *)&skel->name,in_R8);
                }
                poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)local_1a8);
                ::std::operator<<(poVar2,"\n");
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::string::append((string *)err);
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                goto LAB_0027ca58;
              }
              visitSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &visitSet._M_t._M_impl.super__Rb_tree_header._M_header;
              visitSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              visitSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              visitSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_1a8._0_8_ = local_1a8 + 0x10;
              local_1a8._8_8_ = 0;
              local_1a8[0x10] = '\0';
              local_188._M_p = (pointer)&local_178;
              local_180 = 0;
              local_178._M_local_buf[0] = '\0';
              local_168 = -1;
              local_160 = 1.0;
              local_158 = 0.0;
              dStack_150 = 0.0;
              local_148 = 0.0;
              dStack_140 = 0.0;
              local_138 = 1.0;
              local_130 = 0.0;
              dStack_128 = 0.0;
              local_120 = 0.0;
              dStack_118 = 0.0;
              local_110 = 1.0;
              local_108 = 0.0;
              dStack_100 = 0.0;
              local_f8 = 0.0;
              dStack_f0 = 0.0;
              local_e8 = 0;
              uStack_e4 = 0x3ff00000;
              uStack_e0 = 0;
              uStack_dc = 0x3ff00000;
              local_c8 = 0.0;
              dStack_c0 = 0.0;
              local_d8 = 0.0;
              dStack_d0 = 0.0;
              local_b8 = 1.0;
              local_b0 = 0.0;
              dStack_a8 = 0.0;
              local_a0 = 0.0;
              dStack_98 = 0.0;
              local_90 = 1.0;
              local_88 = 0.0;
              dStack_80 = 0.0;
              local_78 = 0.0;
              dStack_70 = 0.0;
              local_68 = 1.0;
              local_60 = (pointer)0x0;
              pSStack_58 = (pointer)0x0;
              local_50 = (pointer)0x0;
              _ss_e = CONCAT44(uStack_31c,0xffffffff);
              visitSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   visitSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              _Var3 = ::std::
                      __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                ();
              bVar1 = _Var3._M_current !=
                      parentJointIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
              if (_Var3._M_current ==
                  parentJointIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar2 = ::std::operator<<(poVar2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                          );
                poVar2 = ::std::operator<<(poVar2,":");
                poVar2 = ::std::operator<<(poVar2,"BuildSkelHierarchy");
                poVar2 = ::std::operator<<(poVar2,"():");
                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xbef);
                ::std::operator<<(poVar2," ");
                poVar2 = ::std::operator<<((ostream *)&ss_e,"Internal error.");
                ::std::operator<<(poVar2,"\n");
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::string::append((string *)err);
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
              }
              else {
                uVar12 = (long)_Var3._M_current -
                         (long)parentJointIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start;
                ::std::__cxx11::string::_M_assign((string *)&local_188);
                ::std::__cxx11::string::_M_assign((string *)local_1a8);
                local_168 = (int)(uVar12 >> 2);
                lVar13 = uVar12 * 0x20;
                lVar6 = 0x10;
                pdVar8 = (double *)
                         ((long)bindTransforms.
                                super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar13);
                pdVar10 = &local_160;
                for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
                  *pdVar10 = *pdVar8;
                  pdVar8 = pdVar8 + (ulong)bVar14 * -2 + 1;
                  pdVar10 = pdVar10 + (ulong)bVar14 * -2 + 1;
                }
                puVar9 = (undefined8 *)
                         (lVar13 + (long)restTransforms.
                                         super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
                puVar11 = (undefined8 *)&uStack_e0;
                for (; lVar6 != 0; lVar6 = lVar6 + -1) {
                  *puVar11 = *puVar9;
                  puVar9 = puVar9 + (ulong)bVar14 * -2 + 1;
                  puVar11 = puVar11 + (ulong)bVar14 * -2 + 1;
                }
                ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                ::vector((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                          *)&local_48,&bindTransforms);
                detail::BuildSkelHierarchyImpl
                          (&visitSet,(SkelNode *)local_1a8,&parentJointIds,&joints,&jointNames,
                           (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                            *)&local_48,&restTransforms,in_stack_fffffffffffffbe0);
                ::std::
                _Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                ::~_Vector_base(&local_48);
                SkelNode::operator=(dst,(SkelNode *)local_1a8);
              }
              SkelNode::~SkelNode((SkelNode *)local_1a8);
              ::std::
              _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              ::~_Rb_tree(&visitSet._M_t);
            }
            else {
LAB_0027ca58:
              bVar1 = false;
            }
            ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&parentJointIds.super__Vector_base<int,_std::allocator<int>_>);
          }
          ::std::_Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
          ::~_Vector_base(&bindTransforms.
                           super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                         );
        }
        ::std::_Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
        ~_Vector_base(&restTransforms.
                       super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                     );
      }
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&jointNames);
      goto LAB_0027ca85;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"BuildSkelHierarchy");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb94);
    ::std::operator<<(poVar2," ");
    pcVar7 = "Skeleton.joints attrbitue is empty: {}";
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"BuildSkelHierarchy");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb8f);
    ::std::operator<<(poVar2," ");
    pcVar7 = "Failed to get Skeleton.joints attrbitue: {}";
  }
  ::std::__cxx11::string::string((string *)&visitSet,pcVar7,(allocator *)&local_378);
  fmt::format<std::__cxx11::string>
            ((string *)local_1a8,(fmt *)&visitSet,(string *)&skel->name,in_RCX);
  poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)local_1a8);
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  if (err != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)err);
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  bVar1 = false;
LAB_0027ca85:
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&joints);
  return bVar1;
}

Assistant:

bool BuildSkelHierarchy(const Skeleton &skel, SkelNode &dst, std::string *err) {
  if (!skel.joints.authored()) {
    PUSH_ERROR_AND_RETURN(fmt::format(
        "Skeleton.joints attrbitue is not authored: {}", skel.name));
  }

  std::vector<value::token> joints;
  if (!skel.joints.get_value(&joints)) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Failed to get Skeleton.joints attrbitue: {}", skel.name));
  }

  if (joints.empty()) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Skeleton.joints attrbitue is empty: {}", skel.name));
  }

  std::vector<value::token> jointNames;

  if (skel.jointNames.authored()) {
    if (!skel.jointNames.get_value(&jointNames)) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Failed to get Skeleton.jointNames attrbitue: {}", skel.name));
    }

    if (joints.size() != jointNames.size()) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Skeleton.joints.size {} must be equal to "
                      "Skeleton.jointNames.size {}: {}",
                      joints.size(), jointNames.size(), skel.name));
    }
  } else {
    // Use joints 
    jointNames.resize(joints.size());
    for (size_t i = 0; i < joints.size(); i++) {
      jointNames[i] = joints[i];
    }
  }


  std::vector<value::matrix4d> restTransforms;
  if (skel.restTransforms.authored()) {
    if (!skel.restTransforms.get_value(&restTransforms)) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Failed to get Skeleton.restTransforms attrbitue: {}", skel.name));
    }
  } else {
    // TODO: Report error when `restTransforms` attribute is omitted?
    restTransforms.assign(joints.size(), value::matrix4d::identity());
  }

  if (joints.size() != restTransforms.size()) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Skeleton.joints.size {} must be equal to "
                    "Skeleton.restTransforms.size {}: {}",
                    joints.size(), restTransforms.size(), skel.name));
  }

  std::vector<value::matrix4d> bindTransforms;
  if (skel.bindTransforms.authored()) {
    if (!skel.bindTransforms.get_value(&bindTransforms)) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Failed to get Skeleton.bindTransforms attrbitue: {}", skel.name));
    }
  } else {
    // TODO: Report error when `restTransforms` attribute is omitted?
    restTransforms.assign(joints.size(), value::matrix4d::identity());
  }

  if (joints.size() != bindTransforms.size()) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Skeleton.joints.size {} must be equal to "
                    "Skeleton.bindTransforms.size {}: {}",
                    joints.size(), bindTransforms.size(), skel.name));
  }

  // Get flattened representation of joint hierarchy with BuildSkelTopology.
  // For root node, parentJointId = -1.
  std::vector<int> parentJointIds;
  if (!BuildSkelTopology(joints, parentJointIds, err)) {
    return false;
  }

  // Just in case. Chek if topology is single-rooted.
  auto nroots = std::count_if(parentJointIds.begin(), parentJointIds.end(),
                              [](int x) { return x == -1; });

  if (nroots == 0) {
    PUSH_ERROR_AND_RETURN(fmt::format(
        "Invalid Skel topology. No root joint found: {}", skel.name));
  }

  if (nroots != 1) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Invalid Skel topology. Topology must be single-rooted, "
                    "but it has {} roots: {}",
                    nroots, skel.name));
  }

  std::set<size_t> visitSet;

  SkelNode root;

  auto it = std::find(parentJointIds.begin(), parentJointIds.end(), -1);
  if (it == parentJointIds.end()) {
    PUSH_ERROR_AND_RETURN("Internal error.");
  }
  size_t rootIdx = size_t(std::distance(parentJointIds.begin(), it));

  root.joint_name = jointNames[rootIdx].str();
  root.joint_path = joints[rootIdx].str();
  root.joint_id = int(rootIdx);
  root.bind_transform = bindTransforms[rootIdx];
  root.rest_transform = restTransforms[rootIdx];

  DCOUT("parentJointIds = " << parentJointIds);
 
  // Construct hierachy from flattened id array.
  if (!detail::BuildSkelHierarchyImpl(visitSet, root, parentJointIds, joints, jointNames,
                                      bindTransforms, restTransforms,
                                      err)) {
    return false;
  }

  dst = root;

  return true;
}